

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O2

exr_result_t
exr_read_chunk(exr_const_context_t_conflict ctxt,int part_index,exr_chunk_info_t *cinfo,
              void *packed_data)

{
  uint uVar1;
  exr_compression_t eVar2;
  uint64_t uVar3;
  exr_priv_part_t p_Var4;
  ulong uVar5;
  exr_result_t eVar6;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE_00;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr *UNRECOVERED_JUMPTABLE;
  char *pcVar7;
  exr_result_t eStack_40;
  int64_t nread;
  uint64_t dataoffset;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    return 2;
  }
  if (ctxt->mode == '\0') {
    if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
      eVar6 = (*ctxt->print_error)
                        (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                         ctxt->print_error);
      return eVar6;
    }
    if ((cinfo != (exr_chunk_info_t *)0x0) &&
       (uVar3 = cinfo->packed_size, packed_data != (void *)0x0 || uVar3 == 0)) {
      p_Var4 = ctxt->parts[(uint)part_index];
      uVar1 = cinfo->idx;
      if (((int)uVar1 < 0) || (p_Var4->chunk_count <= (int)uVar1)) {
        eVar6 = (*ctxt->print_error)
                          (ctxt,3,"invalid chunk index (%d) vs part chunk count %d",(ulong)uVar1,
                           (ulong)(uint)p_Var4->chunk_count,ctxt->print_error);
        return eVar6;
      }
      if (cinfo->type == (char)p_Var4->storage_mode) {
        eVar2 = p_Var4->comp_type;
        if (cinfo->compression == (uint8_t)eVar2) {
          dataoffset = cinfo->data_offset;
          uVar5 = ctxt->file_size;
          if (uVar5 < dataoffset && 0 < (long)uVar5) {
            eVar6 = (*ctxt->print_error)
                              (ctxt,3,"chunk block info data offset (%lu) past end of file (%ld)",
                               dataoffset,uVar5,ctxt->print_error);
            return eVar6;
          }
          if (uVar3 == 0) {
            return 0;
          }
          nread = 0;
          eVar6 = (*ctxt->do_read)(ctxt,packed_data,uVar3,&dataoffset,&nread,
                                   (uint)(eVar2 == EXR_COMPRESSION_NONE));
          if (eVar2 != EXR_COMPRESSION_NONE) {
            return eVar6;
          }
          if (uVar3 - nread == 0 || (long)uVar3 < nread) {
            return eVar6;
          }
          memset((void *)((long)packed_data + nread),0,uVar3 - nread);
          return eVar6;
        }
        UNRECOVERED_JUMPTABLE = ctxt->report_error;
        pcVar7 = "mismatched compression type for chunk block info";
      }
      else {
        UNRECOVERED_JUMPTABLE = ctxt->report_error;
        pcVar7 = "mismatched storage type for chunk block info";
      }
      eVar6 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar7);
      return eVar6;
    }
    UNRECOVERED_JUMPTABLE_00 = ctxt->standard_error;
    eStack_40 = 3;
  }
  else {
    UNRECOVERED_JUMPTABLE_00 = ctxt->standard_error;
    eStack_40 = 7;
  }
  eVar6 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,eStack_40);
  return eVar6;
}

Assistant:

exr_result_t
exr_read_chunk (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    void*                   packed_data)
{
    exr_result_t                 rv;
    uint64_t                     dataoffset, toread;
    int64_t                      nread;
    enum _INTERNAL_EXR_READ_MODE rmode = EXR_MUST_READ_ALL;
    EXR_READONLY_AND_DEFINE_PART (part_index);

    if (!cinfo) return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);
    if (cinfo->packed_size > 0 && !packed_data)
        return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    if (cinfo->idx < 0 || cinfo->idx >= part->chunk_count)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "invalid chunk index (%d) vs part chunk count %d",
            cinfo->idx,
            part->chunk_count);
    if (cinfo->type != (uint8_t) part->storage_mode)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "mismatched storage type for chunk block info");
    if (cinfo->compression != (uint8_t) part->comp_type)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "mismatched compression type for chunk block info");

    dataoffset = cinfo->data_offset;
    if (ctxt->file_size > 0 && dataoffset > (uint64_t) ctxt->file_size)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "chunk block info data offset (%" PRIu64
            ") past end of file (%" PRId64 ")",
            dataoffset,
            ctxt->file_size);

    /* allow a short read if uncompressed */
    if (part->comp_type == EXR_COMPRESSION_NONE) rmode = EXR_ALLOW_SHORT_READ;

    toread = cinfo->packed_size;
    if (toread > 0)
    {
        nread = 0;
        rv    = ctxt->do_read (
            ctxt, packed_data, toread, &dataoffset, &nread, rmode);

        if (rmode == EXR_ALLOW_SHORT_READ && nread < (int64_t) toread)
            memset (
                ((uint8_t*) packed_data) + nread,
                0,
                toread - (uint64_t) (nread));
    }
    else
        rv = EXR_ERR_SUCCESS;

    return rv;
}